

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.hpp
# Opt level: O0

margin_line<plot::HBox<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
* __thiscall
plot::detail::
margin_line<plot::HBox<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
::next(margin_line<plot::HBox<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       *__return_storage_ptr__,
      margin_line<plot::HBox<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
      *this)

{
  long lVar1;
  Margin<plot::HBox<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  *pMVar2;
  ptrdiff_t overflow;
  bool bVar3;
  block_iterator local_a68;
  block_iterator<plot::HBox<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::hbox_line<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  local_858;
  block_iterator<plot::HBox<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::hbox_line<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  local_648;
  block_iterator local_438;
  block_iterator local_228;
  margin_line<plot::HBox<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  *local_18;
  margin_line<plot::HBox<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  *this_local;
  
  local_18 = this;
  this_local = __return_storage_ptr__;
  if ((this->overflow_ == 0) &&
     (bVar3 = block_iterator<plot::HBox<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::hbox_line<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
              ::operator==(&this->line_,&this->end_), !bVar3)) {
    pMVar2 = this->margin_;
    overflow = this->overflow_;
    memcpy(&local_858,&this->line_,0x210);
    std::
    next<plot::detail::block_iterator<plot::HBox<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>>,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>>,plot::detail::hbox_line<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>>,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>>>>
              (&local_648,&local_858,1);
    memcpy(&local_a68,&this->end_,0x210);
    margin_line(__return_storage_ptr__,pMVar2,overflow,&local_648,&local_a68);
    return __return_storage_ptr__;
  }
  pMVar2 = this->margin_;
  lVar1 = this->overflow_;
  memcpy(&local_228,&this->line_,0x210);
  memcpy(&local_438,&this->end_,0x210);
  margin_line(__return_storage_ptr__,pMVar2,lVar1 + 1,&local_228,&local_438);
  return __return_storage_ptr__;
}

Assistant:

margin_line next() const {
            return (overflow_ || line_ == end_) ? margin_line(margin_, overflow_ + 1, line_, end_)
                                                : margin_line(margin_, overflow_, std::next(line_), end_);
        }